

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.hpp
# Opt level: O0

string * CLI::detail::convert_arg_for_ini(string *__return_storage_ptr__,string *arg)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  double *output;
  allocator local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  allocator local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined8 local_d8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  char *local_c8;
  undefined8 local_b8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  char *local_a8;
  undefined8 local_98;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  char *local_88;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  double val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *arg_local;
  
  local_18 = arg;
  arg_local = __return_storage_ptr__;
  uVar3 = ::std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    bVar1 = ::std::operator==(local_18,"true");
    if ((((bVar1) || (bVar1 = ::std::operator==(local_18,"false"), bVar1)) ||
        (bVar1 = ::std::operator==(local_18,"nan"), bVar1)) ||
       (bVar1 = ::std::operator==(local_18,"inf"), bVar1)) {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_18);
    }
    else {
      iVar2 = ::std::__cxx11::string::compare((ulong)local_18,0,(char *)0x2);
      if (((iVar2 == 0) ||
          (iVar2 = ::std::__cxx11::string::compare((ulong)local_18,0,(char *)0x2), iVar2 == 0)) ||
         (bVar1 = lexical_cast<double,_(CLI::detail::enabler)0>
                            ((detail *)local_18,(string *)local_38,output), !bVar1)) {
        lVar4 = ::std::__cxx11::string::size();
        if (lVar4 == 1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_78,"\'",&local_79);
          ::std::operator+(&local_58,&local_78,local_18);
          ::std::operator+(__return_storage_ptr__,&local_58,'\'');
          ::std::__cxx11::string::~string((string *)&local_58);
          ::std::__cxx11::string::~string((string *)&local_78);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
        }
        else {
          pcVar5 = (char *)::std::__cxx11::string::front();
          if (*pcVar5 == '0') {
            pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)local_18);
            if (*pcVar5 == 'x') {
              local_90._M_current = (char *)::std::__cxx11::string::begin();
              local_88 = (char *)__gnu_cxx::
                                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ::operator+(&local_90,2);
              local_98 = ::std::__cxx11::string::end();
              bVar1 = ::std::
                      all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&)::_lambda(char)_1_>
                                (local_88,local_98);
              if (bVar1) {
                ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_18);
                return __return_storage_ptr__;
              }
            }
            else {
              pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)local_18);
              if (*pcVar5 == 'o') {
                local_b0._M_current = (char *)::std::__cxx11::string::begin();
                local_a8 = (char *)__gnu_cxx::
                                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ::operator+(&local_b0,2);
                local_b8 = ::std::__cxx11::string::end();
                bVar1 = ::std::
                        all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&)::_lambda(char)_2_>
                                  (local_a8,local_b8);
                if (bVar1) {
                  ::std::__cxx11::string::string
                            ((string *)__return_storage_ptr__,(string *)local_18);
                  return __return_storage_ptr__;
                }
              }
              else {
                pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)local_18);
                if (*pcVar5 == 'b') {
                  local_d0._M_current = (char *)::std::__cxx11::string::begin();
                  local_c8 = (char *)__gnu_cxx::
                                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ::operator+(&local_d0,2);
                  local_d8 = ::std::__cxx11::string::end();
                  bVar1 = ::std::
                          all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&)::_lambda(char)_3_>
                                    (local_c8,local_d8);
                  if (bVar1) {
                    ::std::__cxx11::string::string
                              ((string *)__return_storage_ptr__,(string *)local_18);
                    return __return_storage_ptr__;
                  }
                }
              }
            }
          }
          lVar4 = ::std::__cxx11::string::find_first_of((char)local_18,0x22);
          if (lVar4 == -1) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_120,"\"",&local_121);
            ::std::operator+(&local_100,&local_120,local_18);
            ::std::operator+(__return_storage_ptr__,&local_100,'\"');
            ::std::__cxx11::string::~string((string *)&local_100);
            ::std::__cxx11::string::~string((string *)&local_120);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_121);
          }
          else {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_168,"\'",&local_169);
            ::std::operator+(&local_148,&local_168,local_18);
            ::std::operator+(__return_storage_ptr__,&local_148,'\'');
            ::std::__cxx11::string::~string((string *)&local_148);
            ::std::__cxx11::string::~string((string *)&local_168);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_169);
          }
        }
      }
      else {
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_18);
      }
    }
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,2,'\"',(allocator *)&stack0xffffffffffffffe7);
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe7);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string convert_arg_for_ini(const std::string &arg) {
    if(arg.empty()) {
        return std::string(2, '"');
    }
    // some specifically supported strings
    if(arg == "true" || arg == "false" || arg == "nan" || arg == "inf") {
        return arg;
    }
    // floating point conversion can convert some hex codes, but don't try that here
    if(arg.compare(0, 2, "0x") != 0 && arg.compare(0, 2, "0X") != 0) {
        double val;
        if(detail::lexical_cast(arg, val)) {
            return arg;
        }
    }
    // just quote a single non numeric character
    if(arg.size() == 1) {
        return std::string("'") + arg + '\'';
    }
    // handle hex, binary or octal arguments
    if(arg.front() == '0') {
        if(arg[1] == 'x') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) {
                   return (x >= '0' && x <= '9') || (x >= 'A' && x <= 'F') || (x >= 'a' && x <= 'f');
               })) {
                return arg;
            }
        } else if(arg[1] == 'o') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x >= '0' && x <= '7'); })) {
                return arg;
            }
        } else if(arg[1] == 'b') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x == '0' || x == '1'); })) {
                return arg;
            }
        }
    }
    if(arg.find_first_of('"') == std::string::npos) {
        return std::string("\"") + arg + '"';
    } else {
        return std::string("'") + arg + '\'';
    }
}